

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvariant.cpp
# Opt level: O2

qreal __thiscall QVariant::toReal(QVariant *this,bool *ok)

{
  double dVar1;
  
  dVar1 = qNumVariantToHelper<double>(&this->d,ok);
  return dVar1;
}

Assistant:

qreal QVariant::toReal(bool *ok) const
{
    return qNumVariantToHelper<qreal>(d, ok);
}